

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errhandl.c
# Opt level: O0

void LASError(LASErrIdType ErrId,char *ProcName,char *Object1Name,char *Object2Name,
             char *Object3Name)

{
  size_t sVar1;
  char *Object3Name_local;
  char *Object2Name_local;
  char *Object1Name_local;
  char *ProcName_local;
  LASErrIdType ErrId_local;
  
  LASErrId = ErrId;
  if (LASProcName != (char *)0x0) {
    free(LASProcName);
  }
  if (LASObject1Name != (char *)0x0) {
    free(LASObject1Name);
  }
  if (LASObject2Name != (char *)0x0) {
    free(LASObject2Name);
  }
  if (LASObject3Name != (char *)0x0) {
    free(LASObject2Name);
  }
  LASProcName = (char *)0x0;
  LASObject1Name = (char *)0x0;
  LASObject2Name = (char *)0x0;
  LASObject3Name = (char *)0x0;
  sVar1 = strlen(ProcName);
  LASProcName = (char *)malloc(sVar1 + 1);
  if (LASProcName == (char *)0x0) {
    strcpy((char *)0x0,"(procedure unknown)");
  }
  else {
    strcpy(LASProcName,ProcName);
    if ((Object1Name != (char *)0x0) && (sVar1 = strlen(Object1Name), sVar1 != 0)) {
      sVar1 = strlen(Object1Name);
      LASObject1Name = (char *)malloc(sVar1 + 1);
      if (LASObject1Name != (char *)0x0) {
        strcpy(LASObject1Name,Object1Name);
      }
    }
    if ((Object2Name != (char *)0x0) && (sVar1 = strlen(Object2Name), sVar1 != 0)) {
      sVar1 = strlen(Object2Name);
      LASObject2Name = (char *)malloc(sVar1 + 1);
      if (LASObject2Name != (char *)0x0) {
        strcpy(LASObject2Name,Object2Name);
      }
    }
    if ((Object3Name != (char *)0x0) && (sVar1 = strlen(Object3Name), sVar1 != 0)) {
      sVar1 = strlen(Object3Name);
      LASObject3Name = (char *)malloc(sVar1 + 1);
      if (LASObject3Name != (char *)0x0) {
        strcpy(LASObject3Name,Object3Name);
      }
    }
  }
  WriteLASErrDescr(_stderr);
  return;
}

Assistant:

void LASError(LASErrIdType ErrId, char *ProcName, char *Object1Name,
	      char *Object2Name, char *Object3Name)
/* Set error status to ErrId, ... */
{
    LASErrId = ErrId;
    
    /* release current values of error variables */
    if (LASProcName != NULL)
        free(LASProcName);
    if (LASObject1Name != NULL)
        free(LASObject1Name);
    if (LASObject2Name != NULL)
        free(LASObject2Name);
    if (LASObject3Name != NULL)
        free(LASObject2Name);
    LASProcName = NULL;
    LASObject1Name = NULL;
    LASObject2Name = NULL;
    LASObject3Name = NULL;
    
    LASProcName = (char *)malloc((strlen(ProcName) + 1) * sizeof(char));
    if (LASProcName != NULL) {
        strcpy(LASProcName, ProcName);
	
	if (Object1Name != NULL && strlen(Object1Name) > 0) {
            LASObject1Name = (char *)malloc((strlen(Object1Name) + 1) * sizeof(char));
            if (LASObject1Name != NULL)
                strcpy(LASObject1Name, Object1Name);
	}
	if (Object2Name != NULL && strlen(Object2Name) > 0) {
            LASObject2Name = (char *)malloc((strlen(Object2Name) + 1) * sizeof(char));
            if (LASObject2Name != NULL)
                strcpy(LASObject2Name, Object2Name);
	}
	if (Object3Name != NULL && strlen(Object3Name) > 0) {
            LASObject3Name = (char *)malloc((strlen(Object3Name) + 1) * sizeof(char));
            if (LASObject3Name != NULL)
                strcpy(LASObject3Name, Object3Name);
	}
    } else {
        strcpy(LASProcName, "(procedure unknown)");
    }

    WriteLASErrDescr(stderr);

}